

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# tpzeqnarray.cpp
# Opt level: O2

void __thiscall
TPZEqnArray<std::complex<long_double>_>::TPZEqnArray(TPZEqnArray<std::complex<long_double>_> *this)

{
  TPZStack<int,_100>::TPZStack(&this->fEqStart);
  TPZStack<int,_100>::TPZStack(&this->fEqNumber);
  TPZStack<std::complex<long_double>,_1000>::TPZStack(&this->fEqValues);
  TPZStack<int,_1000>::TPZStack(&this->fIndex);
  TPZStack<int,_100>::Push(&this->fEqStart,0);
  this->fLastTerm = 0;
  this->fSymmetric = EIsUndefined;
  this->fNumEq = 0;
  return;
}

Assistant:

TPZEqnArray<TVar>::TPZEqnArray() : fEqStart(), fEqNumber(), fEqValues(), fIndex() {
	fEqStart.Push(0);
	fNumEq=0;
	fLastTerm=0;
	fSymmetric=EIsUndefined;
	
}